

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddInputCharacterUTF16(ImGuiIO *this,ImWchar16 c)

{
  int *piVar1;
  ImWchar16 IVar2;
  unsigned_short *puVar3;
  int iVar4;
  unsigned_short *puVar5;
  int iVar6;
  int iVar7;
  
  IVar2 = this->InputQueueSurrogate;
  if (c != 0 || IVar2 != 0) {
    if ((c & 0xfc00) == 0xd800) {
      if (IVar2 != 0) {
        iVar4 = (this->InputQueueCharacters).Size;
        if (iVar4 == (this->InputQueueCharacters).Capacity) {
          if (iVar4 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar4 / 2 + iVar4;
          }
          iVar7 = iVar4 + 1;
          if (iVar4 + 1 < iVar6) {
            iVar7 = iVar6;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          puVar5 = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar7 * 2,GImAllocatorUserData);
          puVar3 = (this->InputQueueCharacters).Data;
          if (puVar3 != (unsigned_short *)0x0) {
            memcpy(puVar5,puVar3,(long)(this->InputQueueCharacters).Size * 2);
            puVar3 = (this->InputQueueCharacters).Data;
            if ((puVar3 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
          }
          (this->InputQueueCharacters).Data = puVar5;
          (this->InputQueueCharacters).Capacity = iVar7;
          iVar4 = (this->InputQueueCharacters).Size;
        }
        else {
          puVar5 = (this->InputQueueCharacters).Data;
        }
        puVar5[iVar4] = 0xfffd;
        (this->InputQueueCharacters).Size = (this->InputQueueCharacters).Size + 1;
      }
      this->InputQueueSurrogate = c;
    }
    else {
      if (IVar2 != 0) {
        IVar2 = 0xfffd;
        if ((c & 0xfc00) != 0xdc00) {
          iVar4 = (this->InputQueueCharacters).Size;
          if (iVar4 == (this->InputQueueCharacters).Capacity) {
            if (iVar4 == 0) {
              iVar6 = 8;
            }
            else {
              iVar6 = iVar4 / 2 + iVar4;
            }
            iVar7 = iVar4 + 1;
            if (iVar4 + 1 < iVar6) {
              iVar7 = iVar6;
            }
            if (GImGui != (ImGuiContext *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            puVar5 = (unsigned_short *)
                     (*GImAllocatorAllocFunc)((long)iVar7 * 2,GImAllocatorUserData);
            puVar3 = (this->InputQueueCharacters).Data;
            if (puVar3 != (unsigned_short *)0x0) {
              memcpy(puVar5,puVar3,(long)(this->InputQueueCharacters).Size * 2);
              puVar3 = (this->InputQueueCharacters).Data;
              if ((puVar3 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
            }
            (this->InputQueueCharacters).Data = puVar5;
            (this->InputQueueCharacters).Capacity = iVar7;
            iVar4 = (this->InputQueueCharacters).Size;
          }
          else {
            puVar5 = (this->InputQueueCharacters).Data;
          }
          puVar5[iVar4] = 0xfffd;
          (this->InputQueueCharacters).Size = (this->InputQueueCharacters).Size + 1;
          IVar2 = c;
        }
        c = IVar2;
        this->InputQueueSurrogate = 0;
      }
      iVar4 = (this->InputQueueCharacters).Size;
      if (iVar4 == (this->InputQueueCharacters).Capacity) {
        if (iVar4 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar4 / 2 + iVar4;
        }
        iVar7 = iVar4 + 1;
        if (iVar4 + 1 < iVar6) {
          iVar7 = iVar6;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        puVar5 = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar7 * 2,GImAllocatorUserData);
        puVar3 = (this->InputQueueCharacters).Data;
        if (puVar3 != (unsigned_short *)0x0) {
          memcpy(puVar5,puVar3,(long)(this->InputQueueCharacters).Size * 2);
          puVar3 = (this->InputQueueCharacters).Data;
          if ((puVar3 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
        }
        (this->InputQueueCharacters).Data = puVar5;
        (this->InputQueueCharacters).Capacity = iVar7;
        iVar4 = (this->InputQueueCharacters).Size;
      }
      else {
        puVar5 = (this->InputQueueCharacters).Data;
      }
      puVar5[iVar4] = c;
      (this->InputQueueCharacters).Size = (this->InputQueueCharacters).Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacterUTF16(ImWchar16 c)
{
    if (c == 0 && InputQueueSurrogate == 0)
        return;

    if ((c & 0xFC00) == 0xD800) // High surrogate, must save
    {
        if (InputQueueSurrogate != 0)
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        InputQueueSurrogate = c;
        return;
    }

    ImWchar cp = c;
    if (InputQueueSurrogate != 0)
    {
        if ((c & 0xFC00) != 0xDC00) // Invalid low surrogate
        {
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        }
        else
        {
#if IM_UNICODE_CODEPOINT_MAX == 0xFFFF
            cp = IM_UNICODE_CODEPOINT_INVALID; // Codepoint will not fit in ImWchar
#else
            cp = (ImWchar)(((InputQueueSurrogate - 0xD800) << 10) + (c - 0xDC00) + 0x10000);
#endif
        }

        InputQueueSurrogate = 0;
    }
    InputQueueCharacters.push_back(cp);
}